

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDFloat32x4Operation::OpReciprocalSqrt(SIMDValue *value)

{
  undefined1 auVar1 [16];
  _x86_SIMDValue _Var2;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar3;
  X86SIMDValue v;
  X86SIMDValue temp;
  X86SIMDValue x86Result;
  SIMDValue *value_local;
  
  _Var2 = _x86_SIMDValue::ToX86SIMDValue(value);
  auVar1 = divps((undefined1  [16])X86_ALL_ONES_F4.field_0,(undefined1  [16])_Var2.field_0);
  register0x00001200 = sqrtps(auVar1,auVar1);
  aVar3 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&temp.field_0 + 8));
  return (SIMDValue)aVar3;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpReciprocalSqrt(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue temp;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        temp.m128_value = _mm_div_ps(X86_ALL_ONES_F4.m128_value, v.m128_value); // temp = 1.0/value
        x86Result.m128_value = _mm_sqrt_ps(temp.m128_value);              // result = sqrt(1.0/value)

        return X86SIMDValue::ToSIMDValue(x86Result);
    }